

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

char * feat_prompt(wchar_t oid)

{
  char *pcStack_10;
  wchar_t oid_local;
  
  if (f_uik_lighting == LIGHTING_LOS) {
    pcStack_10 = ", \'t/T\' for lighting (LOS)";
  }
  else if (f_uik_lighting == LIGHTING_TORCH) {
    pcStack_10 = ", \'t/T\' for lighting (torch)";
  }
  else if (f_uik_lighting == LIGHTING_LIT) {
    pcStack_10 = ", \'t/T\' for lighting (lit)";
  }
  else {
    pcStack_10 = ", \'t/T\' for lighting (dark)";
  }
  return pcStack_10;
}

Assistant:

static const char *feat_prompt(int oid)
{
	(void)oid;
		switch (f_uik_lighting) {
				case LIGHTING_LIT:  return ", 't/T' for lighting (lit)";
                case LIGHTING_TORCH: return ", 't/T' for lighting (torch)";
				case LIGHTING_LOS:  return ", 't/T' for lighting (LOS)";
				default:	return ", 't/T' for lighting (dark)";
		}		
}